

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_create(JSContext *ctx,JSValue ctor,int argc,JSValue *argv)

{
  JSValue v;
  JSValue obj;
  JSValue JVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar5;
  int64_t len;
  int new_len;
  JSValue ret;
  JSContext *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  JSValueUnion in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  int64_t local_60;
  long local_58;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  uVar2 = uStack_c;
  JVar5.tag = in_stack_ffffffffffffff90;
  JVar5.u.ptr = in_stack_ffffffffffffff88.ptr;
  JVar5 = JS_CallConstructor((JSContext *)in_stack_ffffffffffffff80.ptr,JVar5,
                             in_stack_ffffffffffffff7c,(JSValue *)in_stack_ffffffffffffff70);
  local_60 = JVar5.tag;
  iVar3 = JS_IsException(JVar5);
  local_10 = JVar5.u._0_4_;
  uStack_c = JVar5.u._4_4_;
  if (iVar3 != 0) {
    local_8 = local_60;
    goto LAB_001b3a6b;
  }
  obj.tag = (int64_t)in_stack_ffffffffffffff88.ptr;
  obj.u.ptr = in_stack_ffffffffffffff80.ptr;
  iVar3 = js_typed_array_get_length_internal
                    ((JSContext *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),obj)
  ;
  if (-1 < iVar3) {
    if (in_ECX != 1) {
LAB_001b3a51:
      local_8 = local_60;
      goto LAB_001b3a6b;
    }
    in_stack_ffffffffffffff70 = in_RDI;
    JVar5 = JS_DupValue(in_RDI,*in_R8);
    iVar4 = JS_ToLengthFree((JSContext *)in_stack_ffffffffffffff80.ptr,
                            (int64_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                            ,JVar5);
    if (iVar4 == 0) {
      if (local_58 <= iVar3) goto LAB_001b3a51;
      JVar5 = JS_ThrowTypeError(in_RDI,"TypedArray length is too small");
      in_stack_ffffffffffffff78 = JVar5.u._0_4_;
      in_stack_ffffffffffffff7c = JVar5.u._4_4_;
      in_stack_ffffffffffffff80 = (JSValueUnion)JVar5.tag;
    }
  }
  v.u._4_4_ = in_stack_ffffffffffffff7c;
  v.u.int32 = in_stack_ffffffffffffff78;
  v.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
  JS_FreeValue(in_stack_ffffffffffffff70,v);
  local_10 = 0;
  local_8 = 6;
  uStack_c = uVar2;
LAB_001b3a6b:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_typed_array_create(JSContext *ctx, JSValueConst ctor,
                                     int argc, JSValueConst *argv)
{
    JSValue ret;
    int new_len;
    int64_t len;

    ret = JS_CallConstructor(ctx, ctor, argc, argv);
    if (JS_IsException(ret))
        return ret;
    /* validate the typed array */
    new_len = js_typed_array_get_length_internal(ctx, ret);
    if (new_len < 0)
        goto fail;
    if (argc == 1) {
        /* ensure that it is large enough */
        if (JS_ToLengthFree(ctx, &len, JS_DupValue(ctx, argv[0])))
            goto fail;
        if (new_len < len) {
            JS_ThrowTypeError(ctx, "TypedArray length is too small");
        fail:
            JS_FreeValue(ctx, ret);
            return JS_EXCEPTION;
        }
    }
    return ret;
}